

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl.c
# Opt level: O0

int glad_gl_get_extensions(int version,char **out_exts,uint *out_num_exts_i,char ***out_exts_i)

{
  GLubyte *pGVar1;
  size_t sVar2;
  void *__dest;
  char *local_str;
  size_t len;
  char *gl_str_tmp;
  char **exts_i;
  uint num_exts_i;
  uint index;
  char ***out_exts_i_local;
  uint *out_num_exts_i_local;
  char **out_exts_local;
  int version_local;
  
  _num_exts_i = out_exts_i;
  out_exts_i_local = (char ***)out_num_exts_i;
  out_num_exts_i_local = (uint *)out_exts;
  out_exts_local._0_4_ = version;
  if (version / 10000 < 3) {
    if (glad_glGetString == (PFNGLGETSTRINGPROC)0x0) {
      return 0;
    }
    pGVar1 = (*glad_glGetString)(0x1f03);
    *(GLubyte **)out_num_exts_i_local = pGVar1;
  }
  else {
    exts_i._4_4_ = 0;
    exts_i._0_4_ = 0;
    gl_str_tmp = (char *)0x0;
    if ((glad_glGetStringi == (PFNGLGETSTRINGIPROC)0x0) ||
       (glad_glGetIntegerv == (PFNGLGETINTEGERVPROC)0x0)) {
      return 0;
    }
    (*glad_glGetIntegerv)(0x821d,(GLint *)&exts_i);
    if ((uint)exts_i != 0) {
      gl_str_tmp = (char *)malloc((ulong)(uint)exts_i << 3);
    }
    if (gl_str_tmp == (char *)0x0) {
      return 0;
    }
    for (exts_i._4_4_ = 0; exts_i._4_4_ < (uint)exts_i; exts_i._4_4_ = exts_i._4_4_ + 1) {
      pGVar1 = (*glad_glGetStringi)(0x1f03,exts_i._4_4_);
      sVar2 = strlen((char *)pGVar1);
      __dest = malloc(sVar2 + 1);
      if (__dest != (void *)0x0) {
        memcpy(__dest,pGVar1,sVar2 + 1);
      }
      *(void **)(gl_str_tmp + (ulong)exts_i._4_4_ * 8) = __dest;
    }
    *(uint *)out_exts_i_local = (uint)exts_i;
    *_num_exts_i = (char **)gl_str_tmp;
  }
  return 1;
}

Assistant:

static int glad_gl_get_extensions( int version, const char **out_exts, unsigned int *out_num_exts_i, char ***out_exts_i) {
#if GLAD_GL_IS_SOME_NEW_VERSION
    if(GLAD_VERSION_MAJOR(version) < 3) {
#else
    GLAD_UNUSED(version);
    GLAD_UNUSED(out_num_exts_i);
    GLAD_UNUSED(out_exts_i);
#endif
        if (glad_glGetString == NULL) {
            return 0;
        }
        *out_exts = (const char *)glad_glGetString(GL_EXTENSIONS);
#if GLAD_GL_IS_SOME_NEW_VERSION
    } else {
        unsigned int index = 0;
        unsigned int num_exts_i = 0;
        char **exts_i = NULL;
        if (glad_glGetStringi == NULL || glad_glGetIntegerv == NULL) {
            return 0;
        }
        glad_glGetIntegerv(GL_NUM_EXTENSIONS, (int*) &num_exts_i);
        if (num_exts_i > 0) {
            exts_i = (char **) malloc(num_exts_i * (sizeof *exts_i));
        }
        if (exts_i == NULL) {
            return 0;
        }
        for(index = 0; index < num_exts_i; index++) {
            const char *gl_str_tmp = (const char*) glad_glGetStringi(GL_EXTENSIONS, index);
            size_t len = strlen(gl_str_tmp) + 1;

            char *local_str = (char*) malloc(len * sizeof(char));
            if(local_str != NULL) {
                memcpy(local_str, gl_str_tmp, len * sizeof(char));
            }

            exts_i[index] = local_str;
        }

        *out_num_exts_i = num_exts_i;
        *out_exts_i = exts_i;
    }
#endif
    return 1;
}